

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

string * node2name_abi_cxx11_(string *__return_storage_ptr__,CfgNode *node)

{
  ostream *poVar1;
  char *pcVar2;
  stringstream ss;
  stringstream local_1a0 [16];
  long local_190 [3];
  uint auStack_178 [88];
  
  if (node != (CfgNode *)0x0) {
    switch(node->m_type) {
    case CFG_ENTRY:
      pcVar2 = "entry";
      break;
    case CFG_BLOCK:
    case CFG_PHANTOM:
      std::__cxx11::stringstream::stringstream(local_1a0);
      *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
           *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffffb5 | 8;
      poVar1 = std::operator<<((ostream *)local_190,"0x");
      CfgNode::node2addr(node);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_1a0);
      return __return_storage_ptr__;
    case CFG_EXIT:
      pcVar2 = "exit";
      break;
    case CFG_HALT:
      pcVar2 = "halt";
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                    ,0x1b9,"std::string node2name(CfgNode *)");
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,(allocator *)local_1a0);
    return __return_storage_ptr__;
  }
  __assert_fail("node != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                ,0x1aa,"std::string node2name(CfgNode *)");
}

Assistant:

static
std::string node2name(CfgNode* node) {
	assert(node != 0);
	switch (node->type()) {
		case CfgNode::CFG_ENTRY:
			return "entry";
		case CfgNode::CFG_PHANTOM:
		case CfgNode::CFG_BLOCK: {
			std::stringstream ss;
			ss << std::hex << "0x" << CfgNode::node2addr(node);
			return ss.str();
			} break;
		case CfgNode::CFG_EXIT:
			return "exit";
		case CfgNode::CFG_HALT:
			return "halt";
		default:
			assert(false);
	}
	return "";
}